

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int call_verify_cb(int ok,X509_STORE_CTX *ctx)

{
  int iVar1;
  X509_STORE_CTX *ctx_local;
  int ok_local;
  
  iVar1 = (*ctx->verify_cb)(ok,ctx);
  if ((iVar1 != 0) && (iVar1 != 1)) {
    abort();
  }
  return iVar1;
}

Assistant:

static int call_verify_cb(int ok, X509_STORE_CTX *ctx) {
  ok = ctx->verify_cb(ok, ctx);
  // Historically, callbacks returning values like -1 would be treated as a mix
  // of success or failure. Insert that callers check correctly.
  //
  // TODO(davidben): Also use this wrapper to constrain which errors may be
  // suppressed, and ensure all |verify_cb| calls remember to fill in an error.
  BSSL_CHECK(ok == 0 || ok == 1);
  return ok;
}